

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildReg2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,uint32 nextOffset)

{
  undefined1 *puVar1;
  Type *pTVar2;
  byte bVar3;
  int iVar4;
  StackSym *pSVar5;
  StackSym *pSVar6;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pPVar7;
  code *pcVar8;
  byte bVar9;
  bool bVar10;
  ValueType valueType;
  RegSlot RVar11;
  uint sourceContextId;
  uint functionId;
  RegOpnd *pRVar12;
  Func *pFVar13;
  RegOpnd *pRVar14;
  Instr *pIVar15;
  undefined4 *puVar16;
  GeneratorBailInInstr *instr;
  BailOutInfo *pBVar17;
  JITTimeFunctionBody *pJVar18;
  FunctionJITTimeInfo *this_01;
  LabelInstr *instr_00;
  uint uVar19;
  uint32 uVar20;
  OpCode opcode;
  undefined6 in_register_00000032;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Func *local_48;
  Func *local_40;
  uint32 local_34;
  
  local_40 = (Func *)CONCAT44(local_40._4_4_,nextOffset);
  uVar19 = (uint)CONCAT62(in_register_00000032,newOpcode);
  local_34 = offset;
  pRVar12 = BuildSrcOpnd(this,R1,TyVar);
  pSVar5 = pRVar12->m_sym;
  bVar10 = false;
  if ((int)uVar19 < 0x10d) {
    if (uVar19 == 0x46) {
      uVar19 = 0x45;
    }
    else {
      if (uVar19 == 0xba) {
        local_40 = (Func *)IR::RegOpnd::New(TyVar,this->m_func);
        pIVar15 = IR::Instr::New(LdFrameDisplay,(Opnd *)local_40,&pRVar12->super_Opnd,this->m_func);
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar11 = JITTimeFunctionBody::GetEnvReg(pJVar18);
        if (RVar11 != 0xffffffff) {
          pRVar12 = BuildSrcOpnd(this,RVar11,TyVar);
          if (pIVar15->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar16 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                ,0x18b,"(this->m_src2 == __null)",
                                "Trying to overwrite existing src.");
            if (!bVar10) goto LAB_004d1c2e;
            *puVar16 = 0;
          }
          pFVar13 = pIVar15->m_func;
          if ((pRVar12->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            local_48 = pIVar15->m_func;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar16 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar10) goto LAB_004d1c2e;
            *puVar16 = 0;
            pFVar13 = local_48;
          }
          bVar9 = (pRVar12->super_Opnd).field_0xb;
          if ((bVar9 & 2) != 0) {
            pRVar12 = (RegOpnd *)IR::Opnd::Copy(&pRVar12->super_Opnd,pFVar13);
            bVar9 = (pRVar12->super_Opnd).field_0xb;
          }
          (pRVar12->super_Opnd).field_0xb = bVar9 | 2;
          pIVar15->m_src2 = &pRVar12->super_Opnd;
        }
        uVar20 = local_34;
        AddInstr(this,pIVar15,local_34);
        pRVar12 = BuildSrcOpnd(this,R0,TyVar);
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar11 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar18);
        pRVar14 = BuildDstOpnd(this,RVar11,TyVar,false,false);
        pIVar15 = IR::Instr::New(LdFrameDisplay,&pRVar14->super_Opnd,&pRVar12->super_Opnd,
                                 (Opnd *)local_40,this->m_func);
        puVar1 = &pRVar14->m_sym->field_0x18;
        *(uint *)puVar1 = *(uint *)puVar1 | 2;
        goto LAB_004d1a13;
      }
      if (uVar19 != 0x108) goto LAB_004d16b6;
      uVar19 = 0x2a;
    }
LAB_004d16b4:
    bVar10 = true;
  }
  else {
    if (uVar19 == 0x10d) {
      uVar19 = 0x10c;
      goto LAB_004d16b4;
    }
    if ((uVar19 == 0x10e) || (uVar19 == 0x182)) {
      pIVar15 = IR::Instr::New(newOpcode,this->m_func);
      pRVar14 = BuildSrcOpnd(this,R0,TyVar);
      if (pIVar15->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar10) goto LAB_004d1c2e;
        *puVar16 = 0;
      }
      pFVar13 = pIVar15->m_func;
      if ((pRVar14->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        local_40 = pIVar15->m_func;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar10) goto LAB_004d1c2e;
        *puVar16 = 0;
        pFVar13 = local_40;
      }
      bVar9 = (pRVar14->super_Opnd).field_0xb;
      if ((bVar9 & 2) != 0) {
        pRVar14 = (RegOpnd *)IR::Opnd::Copy(&pRVar14->super_Opnd,pFVar13);
        bVar9 = (pRVar14->super_Opnd).field_0xb;
      }
      (pRVar14->super_Opnd).field_0xb = bVar9 | 2;
      pIVar15->m_src1 = &pRVar14->super_Opnd;
      if (pIVar15->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar10) goto LAB_004d1c2e;
        *puVar16 = 0;
      }
      pFVar13 = pIVar15->m_func;
      if ((pRVar12->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar16 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                            ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar10) goto LAB_004d1c2e;
        *puVar16 = 0;
      }
      bVar9 = (pRVar12->super_Opnd).field_0xb;
      if ((bVar9 & 2) != 0) {
        pRVar12 = (RegOpnd *)IR::Opnd::Copy(&pRVar12->super_Opnd,pFVar13);
        bVar9 = (pRVar12->super_Opnd).field_0xb;
      }
      (pRVar12->super_Opnd).field_0xb = bVar9 | 2;
      pIVar15->m_src2 = &pRVar12->super_Opnd;
      uVar20 = local_34;
      goto LAB_004d1a13;
    }
  }
LAB_004d16b6:
  pFVar13 = (Func *)BuildDstOpnd(this,R0,TyVar,false,bVar10);
  pSVar6 = (StackSym *)pFVar13->m_threadContextInfo;
  opcode = (OpCode)uVar19;
  uVar19 = uVar19 & 0xffff;
  if (uVar19 < 0x5d) {
    if (uVar19 == 0x1d) {
      SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
      opcode = Ld_A;
    }
    else {
      if (uVar19 == 0x25) {
        local_48 = pFVar13;
        bVar10 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
        if (bVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                              ,0x75c,"(!this->IsLoopBody())",
                              "Attempting to JIT loop body containing Yield");
          if (!bVar10) {
LAB_004d1c2e:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          *puVar16 = 0;
        }
        pIVar15 = IR::Instr::New(Yield,(Opnd *)local_48,&pRVar12->super_Opnd,this->m_func);
        uVar20 = local_34;
        AddInstr(this,pIVar15,local_34);
        pIVar15 = IR::Instr::ConvertToBailOutInstr
                            (pIVar15,pIVar15,BailOutForGeneratorYield,0xffffffff);
        this->m_lastInstr = pIVar15;
        instr = IR::GeneratorBailInInstr::New(pIVar15,this->m_func);
        puVar1 = &(instr->super_LabelInstr).field_0x78;
        *puVar1 = *puVar1 | 4;
        (instr->super_LabelInstr).m_name = L"GeneratorBailInLabel";
        AddInstr(this,(Instr *)instr,uVar20);
        this_00 = this->m_func->m_yieldOffsetResumeLabelList;
        JsUtil::
        List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this_00,0);
        pPVar7 = (this_00->
                 super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).buffer;
        iVar4 = (this_00->
                super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count;
        pPVar7[iVar4].first = (uint)local_40;
        pPVar7[iVar4].second = &instr->super_LabelInstr;
        pPVar7[iVar4].initialized = true;
        pTVar2 = &(this_00->
                  super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                  ).count;
        *pTVar2 = *pTVar2 + 1;
        pBVar17 = IR::Instr::GetBailOutInfo(pIVar15);
        pBVar17->bailInInstr = instr;
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar18);
        this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
        bVar10 = Js::Phases::IsEnabled
                           ((Phases *)&DAT_015cd718,BailInPhase,sourceContextId,functionId);
        if (bVar10) {
          instr_00 = IR::LabelInstr::New(GeneratorOutputBailInTraceLabel,this->m_func,false);
          instr_00->field_0x78 = instr_00->field_0x78 | 4;
          instr_00->m_name = L"OutputBailInTrace";
          AddInstr(this,&instr_00->super_Instr,uVar20);
          pIVar15 = IR::Instr::New(GeneratorOutputBailInTrace,this->m_func);
          AddInstr(this,pIVar15,uVar20);
        }
        pIVar15 = IR::Instr::New(GeneratorResumeYield,(Opnd *)local_48,this->m_func);
        AddInstr(this,pIVar15,uVar20);
        bVar10 = Func::IsJitInDebugMode(this->m_func);
        if (!bVar10) {
          return;
        }
        InsertBailOutForDebugger
                  (this,uVar20,BailOutStep|BailOutBreakPointInFunction|BailOutForceByFlag,
                   (Instr *)0x0);
        return;
      }
      if (uVar19 == 0x45) {
        bVar3 = (pSVar5->m_builtInIndex)._value;
        opcode = Ld_A;
        if (bVar3 != 'H') {
          (pSVar6->m_builtInIndex)._value = bVar3;
        }
      }
    }
  }
  else if (uVar19 < 0xb7) {
    if (uVar19 == 0x5d) {
      IR::Opnd::SetValueType((Opnd *)pFVar13,(ValueType)0x400);
      opcode = Delete_A;
    }
    else if (uVar19 == 0xa0) {
      local_4a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_4c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_4a.field_0,false);
      valueType = ValueType::SetArrayTypeId((ValueType *)&local_4c.field_0,TypeIds_Array);
      IR::Opnd::SetValueType(&pRVar12->super_Opnd,valueType);
      puVar1 = &(pRVar12->super_Opnd).field_0xb;
      *puVar1 = *puVar1 | 1;
      opcode = LdArrHead;
    }
  }
  else {
    if (uVar19 == 0xb7) {
      pIVar15 = IR::Instr::New(LdInnerFrameDisplay,(Opnd *)pFVar13,&pRVar12->super_Opnd,this->m_func
                              );
      uVar20 = local_34;
      AddEnvOpndForInnerFrameDisplay(this,pIVar15,local_34);
      if ((*(uint *)&pSVar6->field_0x18 & 1) != 0) {
        *(uint *)&pSVar6->field_0x18 = *(uint *)&pSVar6->field_0x18 | 2;
      }
LAB_004d1a13:
      AddInstr(this,pIVar15,uVar20);
      return;
    }
    if (uVar19 == 0x109) {
      IR::Opnd::SetValueType((Opnd *)pFVar13,(ValueType)0x800);
      opcode = Conv_Str;
    }
  }
  pIVar15 = IR::Instr::New(opcode,(Opnd *)pFVar13,&pRVar12->super_Opnd,this->m_func);
  AddInstr(this,pIVar15,local_34);
  return;
}

Assistant:

void
IRBuilder::BuildReg2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, uint32 nextOffset)
{
    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(R1);
    StackSym *      symSrc1 = src1Opnd->m_sym;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::Ld_A_ReuseLoc:
        newOpcode = Js::OpCode::Ld_A;
        reuseLoc = true;
        break;

    case Js::OpCode::Typeof_ReuseLoc:
        newOpcode = Js::OpCode::Typeof;
        reuseLoc = true;
        break;

    case Js::OpCode::UnwrapWithObj_ReuseLoc:
        newOpcode = Js::OpCode::UnwrapWithObj;
        reuseLoc = true;
        break;

    case Js::OpCode::SpreadObjectLiteral:
        // fall through
    case Js::OpCode::SetComputedNameVar:
    {
        IR::Instr *instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(this->BuildSrcOpnd(R0));
        instr->SetSrc2(src1Opnd);
        this->AddInstr(instr, offset);
        return;
    }
    case Js::OpCode::LdFuncExprFrameDisplay:
    {
        IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        IR::Instr *instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, m_func);
        Js::RegSlot envReg = this->GetEnvReg();
        if (envReg != Js::Constants::NoRegister)
        {
            instr->SetSrc2(BuildSrcOpnd(envReg));
        }
        this->AddInstr(instr, offset);

        IR::RegOpnd *src2Opnd = dstOpnd;
        src1Opnd = BuildSrcOpnd(R0);
        dstOpnd = BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
        instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, src2Opnd, m_func);
        dstOpnd->m_sym->m_isNotNumber = true;
        this->AddInstr(instr, offset);
        return;
    }
    }

    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0, TyVar, false, reuseLoc);
    StackSym *      dstSym = dstOpnd->m_sym;

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCode::Ld_A:
        if (symSrc1->m_builtInIndex != Js::BuiltinFunction::None)
        {
            // Note: don't set dstSym->m_builtInIndex to None here (see Win8 399972)
            dstSym->m_builtInIndex = symSrc1->m_builtInIndex;
        }
        break;

    case Js::OpCode::Delete_A:
        dstOpnd->SetValueType(ValueType::Boolean);
        break;
    case Js::OpCode::BeginSwitch:
        m_switchBuilder.BeginSwitch();
        newOpcode = Js::OpCode::Ld_A;
        break;
    case Js::OpCode::LdArrHead:
        src1Opnd->SetValueType(
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
        src1Opnd->SetValueTypeFixed();
        break;

    case Js::OpCode::LdInnerFrameDisplayNoParent:
    {
        instr = IR::Instr::New(Js::OpCode::LdInnerFrameDisplay, dstOpnd, src1Opnd, m_func);
        this->AddEnvOpndForInnerFrameDisplay(instr, offset);
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);

        return;
    }

    case Js::OpCode::Conv_Str:
        dstOpnd->SetValueType(ValueType::String);
        break;

    case Js::OpCode::Yield:
        // Jitting Loop Bodies containing Yield is not possible, blocked at callsites of GenerateLoopBody
        AssertMsg(!this->IsLoopBody(), "Attempting to JIT loop body containing Yield");

        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
        this->AddInstr(instr, offset);
        IR::Instr* yieldInstr = instr->ConvertToBailOutInstr(instr, IR::BailOutForGeneratorYield);
        this->m_lastInstr = yieldInstr;

        // This label indicates the bail-in section that we will jump to from the generator jump table
        auto* bailInLabel = IR::GeneratorBailInInstr::New(yieldInstr, m_func);
        bailInLabel->m_hasNonBranchRef = true;              // set to true so that we don't move this label around
        LABELNAMESET(bailInLabel, "GeneratorBailInLabel");
        this->AddInstr(bailInLabel, offset);
        this->m_func->AddYieldOffsetResumeLabel(nextOffset, bailInLabel);

        yieldInstr->GetBailOutInfo()->bailInInstr = bailInLabel;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, this->m_func))
        {
            IR::LabelInstr* traceBailInLabel = IR::LabelInstr::New(Js::OpCode::GeneratorOutputBailInTraceLabel, m_func);
            traceBailInLabel->m_hasNonBranchRef = true;     // set to true so that we don't move this label around
            LABELNAMESET(traceBailInLabel, "OutputBailInTrace");
            this->AddInstr(traceBailInLabel, offset);

            IR::Instr* traceBailIn = IR::Instr::New(Js::OpCode::GeneratorOutputBailInTrace, m_func);
            this->AddInstr(traceBailIn, offset);
        }
#endif

        IR::Instr* resumeYield = IR::Instr::New(Js::OpCode::GeneratorResumeYield, dstOpnd, m_func);
        this->AddInstr(resumeYield, offset);

        if (this->m_func->IsJitInDebugMode())
        {
            this->InsertBailOutForDebugger(offset, IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction | IR::BailOutStep);
        }

        return;
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
    }

    this->AddInstr(instr, offset);
}